

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_lfqx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 EA;
  TCGv_i64 val;
  uint uVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0x15;
  gen_set_access_type(ctx,0x30);
  EA = tcg_temp_new_i64(tcg_ctx);
  val = tcg_temp_new_i64(tcg_ctx);
  gen_addr_reg_index(ctx,EA);
  gen_qemu_ld64_i64(ctx,val,EA);
  set_fpr(tcg_ctx,uVar1 & 0x1f,val);
  gen_addr_add(ctx,EA,EA,8);
  gen_qemu_ld64_i64(ctx,val,EA);
  set_fpr(tcg_ctx,uVar1 + 1 & 0x1f,val);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_lfqx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rd = rD(ctx->opcode);
    TCGv t0;
    TCGv_i64 t1;
    gen_set_access_type(ctx, ACCESS_FLOAT);
    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    gen_qemu_ld64_i64(ctx, t1, t0);
    set_fpr(tcg_ctx, rd, t1);
    gen_addr_add(ctx, t0, t0, 8);
    gen_qemu_ld64_i64(ctx, t1, t0);
    set_fpr(tcg_ctx, (rd + 1) % 32, t1);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}